

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# demangle.cc
# Opt level: O0

bool google::ParseFunctionType(State *state)

{
  bool bVar1;
  undefined1 local_48 [8];
  State copy;
  State *state_local;
  
  copy._40_8_ = state;
  memcpy(local_48,state,0x30);
  bVar1 = ParseOneCharToken((State *)copy._40_8_,'F');
  if (bVar1) {
    bVar1 = ParseOneCharToken((State *)copy._40_8_,'Y');
    bVar1 = Optional(bVar1);
    if (((bVar1) && (bVar1 = ParseBareFunctionType((State *)copy._40_8_), bVar1)) &&
       (bVar1 = ParseOneCharToken((State *)copy._40_8_,'E'), bVar1)) {
      return true;
    }
  }
  memcpy((void *)copy._40_8_,local_48,0x30);
  return false;
}

Assistant:

static bool ParseFunctionType(State *state) {
  State copy = *state;
  if (ParseOneCharToken(state, 'F') &&
      Optional(ParseOneCharToken(state, 'Y')) &&
      ParseBareFunctionType(state) && ParseOneCharToken(state, 'E')) {
    return true;
  }
  *state = copy;
  return false;
}